

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O1

int __thiscall
gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
close(AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *this,int __fd)

{
  undefined4 in_register_00000034;
  
  asio::detail::reactive_socket_service_base::close
            (&((this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.
              service_)->super_reactive_socket_service_base,(int)this + 0x28);
  return *(int *)CONCAT44(in_register_00000034,__fd);
}

Assistant:

std::error_code close(std::error_code& ec)
    {
        return socket_.lowest_layer().close(ec);
    }